

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

region * __thiscall
toml::detail::character_either::scan
          (region *__return_storage_ptr__,character_either *this,location *loc)

{
  char_type_conflict cVar1;
  element_type *peVar2;
  char_type_conflict *pcVar3;
  char_type_conflict cVar4;
  char_type_conflict *pcVar5;
  location first;
  
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    pcVar5 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->chars_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pcVar5 == pcVar3) goto LAB_00323337;
      cVar1 = *pcVar5;
      cVar4 = location::current(loc);
      pcVar5 = pcVar5 + 1;
    } while (cVar4 != cVar1);
    location::location(&first,loc);
    location::advance(loc,1);
    region::region(__return_storage_ptr__,&first,loc);
    location::~location(&first);
  }
  else {
LAB_00323337:
    region::region(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character_either::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    for(const auto c : this->chars_)
    {
        if(loc.current() == c)
        {
            const auto first = loc;
            loc.advance(1);
            return region(first, loc);
        }
    }
    return region{};
}